

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

xmlNodeSetPtr xmlXPathGetElementsByIds(xmlDocPtr doc,xmlChar *ids)

{
  byte *pbVar1;
  xmlNodeSetPtr cur;
  ulong uVar2;
  xmlChar *ID;
  _xmlNode *val;
  byte *pbVar3;
  int iVar4;
  
  if ((ids == (xmlChar *)0x0) ||
     (cur = (xmlNodeSetPtr)(*xmlMalloc)(0x10), cur == (xmlNodeSetPtr)0x0)) {
    return (xmlNodeSetPtr)0x0;
  }
  cur->nodeNr = 0;
  cur->nodeMax = 0;
  cur->nodeTab = (xmlNodePtr *)0x0;
  for (pbVar3 = ids; uVar2 = (ulong)*pbVar3, uVar2 < 0x21; pbVar3 = pbVar3 + 1) {
    if ((0x100002600U >> (uVar2 & 0x3f) & 1) == 0) goto joined_r0x001c2559;
  }
LAB_001c2564:
  iVar4 = (int)pbVar3 - (int)ids;
  while ((0x20 < (byte)uVar2 || ((0x100002601U >> (uVar2 & 0x3f) & 1) == 0))) {
    pbVar1 = pbVar3 + 1;
    pbVar3 = pbVar3 + 1;
    iVar4 = iVar4 + 1;
    uVar2 = (ulong)*pbVar1;
  }
  ID = xmlStrndup(ids,iVar4);
  if (ID != (xmlChar *)0x0) {
    val = (_xmlNode *)xmlGetID(doc,ID);
    (*xmlFree)(ID);
    if ((val == (xmlNodePtr)0x0) ||
       (((val->type != XML_ELEMENT_NODE &&
         ((val->type != XML_ATTRIBUTE_NODE || (val = val->parent, val == (_xmlNode *)0x0)))) ||
        (iVar4 = xmlXPathNodeSetAdd(cur,val), -1 < iVar4)))) {
      for (; uVar2 = (ulong)*pbVar3, ids = pbVar3, uVar2 < 0x21; pbVar3 = pbVar3 + 1) {
        if ((0x100002600U >> (uVar2 & 0x3f) & 1) == 0) goto joined_r0x001c2559;
      }
      goto LAB_001c2564;
    }
  }
  xmlXPathFreeNodeSet(cur);
  return (xmlNodeSetPtr)0x0;
joined_r0x001c2559:
  if (uVar2 == 0) {
    return cur;
  }
  goto LAB_001c2564;
}

Assistant:

static xmlNodeSetPtr
xmlXPathGetElementsByIds (xmlDocPtr doc, const xmlChar *ids) {
    xmlNodeSetPtr ret;
    const xmlChar *cur = ids;
    xmlChar *ID;
    xmlAttrPtr attr;
    xmlNodePtr elem = NULL;

    if (ids == NULL) return(NULL);

    ret = xmlXPathNodeSetCreate(NULL);
    if (ret == NULL)
        return(ret);

    while (IS_BLANK_CH(*cur)) cur++;
    while (*cur != 0) {
	while ((!IS_BLANK_CH(*cur)) && (*cur != 0))
	    cur++;

        ID = xmlStrndup(ids, cur - ids);
	if (ID == NULL) {
            xmlXPathFreeNodeSet(ret);
            return(NULL);
        }
        /*
         * We used to check the fact that the value passed
         * was an NCName, but this generated much troubles for
         * me and Aleksey Sanin, people blatantly violated that
         * constraint, like Visa3D spec.
         * if (xmlValidateNCName(ID, 1) == 0)
         */
        attr = xmlGetID(doc, ID);
        xmlFree(ID);
        if (attr != NULL) {
            if (attr->type == XML_ATTRIBUTE_NODE)
                elem = attr->parent;
            else if (attr->type == XML_ELEMENT_NODE)
                elem = (xmlNodePtr) attr;
            else
                elem = NULL;
            if (elem != NULL) {
                if (xmlXPathNodeSetAdd(ret, elem) < 0) {
                    xmlXPathFreeNodeSet(ret);
                    return(NULL);
                }
            }
        }

	while (IS_BLANK_CH(*cur)) cur++;
	ids = cur;
    }
    return(ret);
}